

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructBuilder * __thiscall
capnp::_::PointerBuilder::initStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size)

{
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  AllocateResult AVar1;
  WirePointer *pWVar2;
  WirePointer *ref;
  uint uVar3;
  AllocateResult AVar4;
  
  ref = this->pointer;
  segment = this->segment;
  AVar1.words = (word *)ref;
  AVar1.segment = segment;
  AVar4.words = (word *)ref;
  AVar4.segment = segment;
  capTable = this->capTable;
  uVar3 = ((uint)size >> 0x10) + ((uint)size & 0xffff);
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  if (uVar3 == 0) {
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  else {
    pWVar2 = (WirePointer *)segment->pos;
    if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
              ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar2)) >> 3 <
        (long)(ulong)uVar3) {
      pWVar2 = (WirePointer *)0x0;
    }
    else {
      segment->pos = (word *)(pWVar2 + uVar3);
    }
    if (pWVar2 == (WirePointer *)0x0) {
      AVar4 = BuilderArena::allocate((BuilderArena *)(segment->super_SegmentReader).arena,uVar3 + 1)
      ;
      (ref->offsetAndKind).value =
           (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar4.segment)->super_SegmentReader).id.value;
      *(undefined4 *)&(AVar4.words)->content = 0;
      ref = (WirePointer *)(AVar4.words + 1);
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar2 - (long)ref) >> 1) & 0xfffffffc) - 4
      ;
      ref = pWVar2;
      AVar4 = AVar1;
    }
  }
  *(StructSize *)((long)&(AVar4.words)->content + 4) = size;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = ref;
  __return_storage_ptr__->pointers = ref + ((uint)size & 0xffff);
  __return_storage_ptr__->dataSize = ((uint)size & 0xffff) << 6;
  __return_storage_ptr__->pointerCount = size.pointers;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder PointerBuilder::initStruct(StructSize size) {
  return WireHelpers::initStructPointer(pointer, segment, capTable, size);
}